

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# allocator.cpp
# Opt level: O3

void __thiscall ncnn::PoolAllocator::PoolAllocator(PoolAllocator *this)

{
  pthread_mutex_t *__mutex;
  
  (this->super_Allocator)._vptr_Allocator = (_func_int **)&PTR__PoolAllocator_005f9330;
  __mutex = (pthread_mutex_t *)operator_new(0x90);
  pthread_mutex_init(__mutex,(pthread_mutexattr_t *)0x0);
  pthread_mutex_init(__mutex + 1,(pthread_mutexattr_t *)0x0);
  *(long *)((long)__mutex + 0x68) = (long)__mutex + 0x60;
  *(long *)((long)__mutex + 0x60) = (long)__mutex + 0x60;
  *(undefined8 *)((long)__mutex + 0x70) = 0;
  *(pthread_mutex_t **)((long)__mutex + 0x80) = __mutex + 3;
  __mutex[3].__align = (long)(__mutex + 3);
  *(undefined8 *)((long)__mutex + 0x88) = 0;
  this->d = (PoolAllocatorPrivate *)__mutex;
  __mutex[2].__data.__lock = 0;
  *(undefined8 *)((long)__mutex + 0x58) = 10;
  return;
}

Assistant:

PoolAllocator::PoolAllocator()
    : Allocator(), d(new PoolAllocatorPrivate)
{
    d->size_compare_ratio = 0;
    d->size_drop_threshold = 10;
}